

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::DenseSupportVectors::ByteSizeLong(DenseSupportVectors *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *pTVar4;
  ulong uVar5;
  long lVar6;
  uint index;
  size_t sVar7;
  
  uVar1 = (this->vectors_).super_RepeatedPtrFieldBase.current_size_;
  sVar7 = (size_t)uVar1;
  if (sVar7 == 0) {
    sVar7 = 0;
  }
  else {
    index = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::DenseVector>::TypeHandler>
                         (&(this->vectors_).super_RepeatedPtrFieldBase,index);
      uVar5 = (ulong)(uint)(pTVar4->values_).current_size_;
      lVar6 = uVar5 * 8;
      uVar3 = (uint)lVar6;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else if ((int)uVar3 < 0) {
        uVar5 = 0xb;
      }
      else {
        iVar2 = 0x1f;
        if ((uVar3 | 1) != 0) {
          for (; (uVar3 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      pTVar4->_values_cached_byte_size_ = uVar3;
      lVar6 = uVar5 + lVar6;
      uVar3 = (uint)lVar6;
      pTVar4->_cached_size_ = uVar3;
      uVar3 = uVar3 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = sVar7 + lVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t DenseSupportVectors::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DenseSupportVectors)
  size_t total_size = 0;

  // repeated .CoreML.Specification.DenseVector vectors = 1;
  {
    unsigned int count = this->vectors_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->vectors(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}